

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O3

iterator __thiscall QCborMap::erase(QCborMap *this,iterator it)

{
  long idx;
  
  detach(this,0);
  idx = it.item.super_QCborValueConstRef.i + -1;
  QCborContainerPrivate::removeAt((this->d).d.ptr,idx);
  QCborContainerPrivate::removeAt((this->d).d.ptr,idx);
  return (iterator)it.item;
}

Assistant:

QCborMap::iterator QCborMap::erase(QCborMap::iterator it)
{
    detach();

    // remove both key and value
    // ### optimize?
    d->removeAt(it.item.i - 1);
    d->removeAt(it.item.i - 1);
    return it;
}